

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firstpass.c
# Opt level: O0

void av1_accumulate_stats(FIRSTPASS_STATS *section,FIRSTPASS_STATS *frame)

{
  double *in_RSI;
  double *in_RDI;
  double dVar1;
  
  *in_RDI = *in_RSI + *in_RDI;
  in_RDI[1] = in_RSI[1] + in_RDI[1];
  in_RDI[2] = in_RSI[2] + in_RDI[2];
  dVar1 = log1p(in_RSI[2]);
  in_RDI[0x1b] = dVar1 + in_RDI[0x1b];
  dVar1 = log1p(in_RSI[4]);
  in_RDI[0x1c] = dVar1 + in_RDI[0x1c];
  in_RDI[3] = in_RSI[3] + in_RDI[3];
  in_RDI[4] = in_RSI[4] + in_RDI[4];
  in_RDI[5] = in_RSI[5] + in_RDI[5];
  in_RDI[6] = in_RSI[6] + in_RDI[6];
  in_RDI[7] = in_RSI[7] + in_RDI[7];
  in_RDI[8] = in_RSI[8] + in_RDI[8];
  in_RDI[9] = in_RSI[9] + in_RDI[9];
  in_RDI[10] = in_RSI[10] + in_RDI[10];
  in_RDI[0xb] = in_RSI[0xb] + in_RDI[0xb];
  in_RDI[0xc] = in_RSI[0xc] + in_RDI[0xc];
  in_RDI[0xd] = in_RSI[0xd] + in_RDI[0xd];
  in_RDI[0xe] = in_RSI[0xe] + in_RDI[0xe];
  in_RDI[0xf] = in_RSI[0xf] + in_RDI[0xf];
  in_RDI[0x10] = in_RSI[0x10] + in_RDI[0x10];
  in_RDI[0x11] = in_RSI[0x11] + in_RDI[0x11];
  in_RDI[0x12] = in_RSI[0x12] + in_RDI[0x12];
  in_RDI[0x13] = in_RSI[0x13] + in_RDI[0x13];
  in_RDI[0x14] = in_RSI[0x14] + in_RDI[0x14];
  in_RDI[0x16] = in_RSI[0x16] + in_RDI[0x16];
  in_RDI[0x15] = in_RSI[0x15] + in_RDI[0x15];
  return;
}

Assistant:

void av1_accumulate_stats(FIRSTPASS_STATS *section,
                          const FIRSTPASS_STATS *frame) {
  section->frame += frame->frame;
  section->weight += frame->weight;
  section->intra_error += frame->intra_error;
  section->log_intra_error += log1p(frame->intra_error);
  section->log_coded_error += log1p(frame->coded_error);
  section->frame_avg_wavelet_energy += frame->frame_avg_wavelet_energy;
  section->coded_error += frame->coded_error;
  section->sr_coded_error += frame->sr_coded_error;
  section->pcnt_inter += frame->pcnt_inter;
  section->pcnt_motion += frame->pcnt_motion;
  section->pcnt_second_ref += frame->pcnt_second_ref;
  section->pcnt_neutral += frame->pcnt_neutral;
  section->intra_skip_pct += frame->intra_skip_pct;
  section->inactive_zone_rows += frame->inactive_zone_rows;
  section->inactive_zone_cols += frame->inactive_zone_cols;
  section->MVr += frame->MVr;
  section->mvr_abs += frame->mvr_abs;
  section->MVc += frame->MVc;
  section->mvc_abs += frame->mvc_abs;
  section->MVrv += frame->MVrv;
  section->MVcv += frame->MVcv;
  section->mv_in_out_count += frame->mv_in_out_count;
  section->new_mv_count += frame->new_mv_count;
  section->count += frame->count;
  section->duration += frame->duration;
}